

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O0

void test_ADynArray_construct_destruct_valid_fn(int _i)

{
  void *dynArray;
  void *_ck_x_3;
  void *_ck_x_2;
  uintmax_t _ck_y_1;
  uintmax_t _ck_x_1;
  uintmax_t _ck_y;
  uintmax_t _ck_x;
  private_ACUtilsTest_ADynArray_CharArray *array;
  int _i_local;
  
  dynArray = private_ACUtils_ADynArray_construct(1);
  if (*(long *)((long)dynArray + 0x18) != 0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x34,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","array->size == 0",
                      "array->size",*(long *)((long)dynArray + 0x18),"0",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x34);
  if (*(long *)((long)dynArray + 0x20) != 8) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x35,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                      "array->capacity == private_ACUtilsTest_ADynArray_capacityMin",
                      "array->capacity",*(long *)((long)dynArray + 0x20),
                      "private_ACUtilsTest_ADynArray_capacityMin",8,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x35);
  if (*(long *)((long)dynArray + 0x28) == 0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x36,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) array->buffer != NULL",
                      "(void*) array->buffer",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x36);
  if (*(long *)((long)dynArray + 0x10) != 0) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x37);
    private_ACUtils_ADynArray_destruct(dynArray);
    return;
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x37,"Assertion \'_ck_x != NULL\' failed","Assertion \'%s\' failed: %s == %#x",
                    "(void*) array->growStrategy != NULL","(void*) array->growStrategy",0,0);
}

Assistant:

START_TEST(test_ADynArray_construct_destruct_valid)
{
    struct private_ACUtilsTest_ADynArray_CharArray *array;
    array = ADynArray_construct(struct private_ACUtilsTest_ADynArray_CharArray);
    ACUTILSTEST_ASSERT_UINT_EQ(array->size, 0);
    ACUTILSTEST_ASSERT_UINT_EQ(array->capacity, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array->buffer);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array->growStrategy);
    ADynArray_destruct(array);
}